

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::find_files::file_desc>::insert
          (vector<crnlib::find_files::file_desc> *this,uint index,file_desc *p,uint n)

{
  uint uVar1;
  file_desc *pfVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint min_new_capacity;
  file_desc *pfVar6;
  
  if (n != 0) {
    uVar1 = this->m_size;
    min_new_capacity = uVar1 + n;
    if (CARRY4(uVar1,n)) {
      pfVar6 = this->m_p + min_new_capacity;
      lVar4 = (ulong)-n * 0x48;
      do {
        find_files::file_desc::~file_desc(pfVar6);
        pfVar6 = pfVar6 + 1;
        lVar4 = lVar4 + -0x48;
      } while (lVar4 != 0);
    }
    else {
      if (this->m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,min_new_capacity,true,0x48,object_mover,false);
      }
      uVar3 = min_new_capacity - this->m_size;
      if (uVar3 != 0) {
        pfVar2 = this->m_p + this->m_size;
        pfVar6 = pfVar2 + uVar3;
        do {
          (pfVar2->m_fullname).m_buf_size = 0;
          (pfVar2->m_fullname).m_len = 0;
          (pfVar2->m_fullname).m_pStr = (char *)0x0;
          (pfVar2->m_base).m_buf_size = 0;
          (pfVar2->m_base).m_len = 0;
          (pfVar2->m_base).m_pStr = (char *)0x0;
          (pfVar2->m_rel).m_buf_size = 0;
          (pfVar2->m_rel).m_len = 0;
          (pfVar2->m_rel).m_pStr = (char *)0x0;
          (pfVar2->m_name).m_buf_size = 0;
          (pfVar2->m_name).m_len = 0;
          (pfVar2->m_name).m_pStr = (char *)0x0;
          pfVar2->m_is_dir = false;
          pfVar2 = pfVar2 + 1;
        } while (pfVar2 != pfVar6);
      }
    }
    this->m_size = min_new_capacity;
    iVar5 = uVar1 - index;
    if (iVar5 != 0) {
      pfVar6 = this->m_p + uVar1;
      do {
        dynamic_string::set(&pfVar6[(ulong)n - 1].m_fullname,&pfVar6[-1].m_fullname,0xffffffff);
        dynamic_string::set(&pfVar6[(ulong)n - 1].m_base,&pfVar6[-1].m_base,0xffffffff);
        dynamic_string::set(&pfVar6[(ulong)n - 1].m_rel,&pfVar6[-1].m_rel,0xffffffff);
        dynamic_string::set(&pfVar6[(ulong)n - 1].m_name,&pfVar6[-1].m_name,0xffffffff);
        pfVar6[(ulong)n - 1].m_is_dir = pfVar6[-1].m_is_dir;
        iVar5 = iVar5 + -1;
        pfVar6 = pfVar6 + -1;
      } while (iVar5 != 0);
    }
    pfVar6 = this->m_p + index;
    iVar5 = n + (n == 0);
    do {
      dynamic_string::set(&pfVar6->m_fullname,&p->m_fullname,0xffffffff);
      dynamic_string::set(&pfVar6->m_base,&p->m_base,0xffffffff);
      dynamic_string::set(&pfVar6->m_rel,&p->m_rel,0xffffffff);
      dynamic_string::set(&pfVar6->m_name,&p->m_name,0xffffffff);
      pfVar6->m_is_dir = p->m_is_dir;
      pfVar6 = pfVar6 + 1;
      p = p + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

inline void insert(uint index, const T* p, uint n)
        {
            CRNLIB_ASSERT(index <= m_size);
            if (!n)
            {
                return;
            }

            const uint orig_size = m_size;
            resize(m_size + n, true);

            const uint num_to_move = orig_size - index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This overwrites the destination object bits, but bitwise copyable means we don't need to worry about destruction.
                memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            }
            else
            {
                const T* pSrc = m_p + orig_size - 1;
                T* pDst = const_cast<T*>(pSrc) + n;

                for (uint i = 0; i < num_to_move; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst-- = *pSrc--;
                }
            }

            T* pDst = m_p + index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This copies in the new bits, overwriting the existing objects, which is OK for copyable types that don't need destruction.
                memcpy(pDst, p, sizeof(T) * n);
            }
            else
            {
                for (uint i = 0; i < n; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst++ = *p++;
                }
            }
        }